

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O2

QDebug operator<<(QDebug debug,QOpenGLTexture *t)

{
  long lVar1;
  QOpenGLTexturePrivate *pQVar2;
  bool bVar3;
  QDebug *pQVar4;
  QOpenGLTexture *in_RDX;
  long in_FS_OFFSET;
  QDebug local_b8;
  QDebug local_b0;
  QDebug local_a8;
  QDebug local_a0;
  QDebug local_98;
  QDebug local_90;
  QDebug local_88;
  QDebug local_80;
  QDebug local_78;
  undefined1 local_70 [8];
  QDebug local_68;
  QScopedPointer<QOpenGLTexturePrivate,_QScopedPointerDeleter<QOpenGLTexturePrivate>_> local_60;
  QDebug local_58;
  QDebug local_50;
  undefined1 local_48 [8];
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)t);
  *(undefined1 *)&((t->d_ptr).d)->requestedMipLevels = 0;
  QDebug::operator<<((QDebug *)t,"QOpenGLTexture(");
  if (in_RDX == (QOpenGLTexture *)0x0) {
    QDebug::operator<<((QDebug *)t,'0');
  }
  else {
    pQVar2 = (in_RDX->d_ptr).d;
    local_60.d = (t->d_ptr).d;
    (local_60.d)->dimensions[1] = (local_60.d)->dimensions[1] + 1;
    operator<<((Stream *)&local_58,(Target)&local_60);
    pQVar4 = QDebug::operator<<(&local_58,", bindingTarget=");
    local_50.stream = pQVar4->stream;
    *(int *)(local_50.stream + 0x28) = *(int *)(local_50.stream + 0x28) + 1;
    operator<<((Stream *)local_48,(BindingTarget)&local_50);
    pQVar4 = QDebug::operator<<((QDebug *)local_48,", size=[");
    pQVar4 = QDebug::operator<<(pQVar4,pQVar2->dimensions[0]);
    pQVar4 = QDebug::operator<<(pQVar4,", ");
    QDebug::operator<<(pQVar4,pQVar2->dimensions[1]);
    QDebug::~QDebug((QDebug *)local_48);
    QDebug::~QDebug(&local_50);
    QDebug::~QDebug(&local_58);
    QDebug::~QDebug((QDebug *)&local_60);
    if (pQVar2->target == Target3D) {
      pQVar4 = QDebug::operator<<((QDebug *)t,", ");
      QDebug::operator<<(pQVar4,pQVar2->dimensions[2]);
    }
    pQVar4 = QDebug::operator<<((QDebug *)t,"], format=");
    local_68.stream = pQVar4->stream;
    *(int *)(local_68.stream + 0x28) = *(int *)(local_68.stream + 0x28) + 1;
    operator<<((Stream *)local_48,(TextureFormat)&local_68);
    pQVar4 = QDebug::operator<<((QDebug *)local_48,", formatClass=");
    QDebug::operator<<(pQVar4,pQVar2->formatClass);
    QDebug::~QDebug((QDebug *)local_48);
    QDebug::~QDebug(&local_68);
    if (((in_RDX->d_ptr).d)->textureId != 0) {
      pQVar4 = QDebug::operator<<((QDebug *)t,", textureId=");
      QDebug::operator<<(pQVar4,pQVar2->textureId);
    }
    bVar3 = QOpenGLTexture::isBound(in_RDX);
    if (bVar3) {
      QDebug::operator<<((QDebug *)t,", [bound]");
    }
    if (((in_RDX->d_ptr).d)->textureView == true) {
      QDebug::operator<<((QDebug *)t,", [view]");
    }
    if (pQVar2->fixedSamplePositions == true) {
      QDebug::operator<<((QDebug *)t,", [fixedSamplePositions]");
    }
    pQVar4 = QDebug::operator<<((QDebug *)t,", mipLevels=");
    pQVar4 = QDebug::operator<<(pQVar4,pQVar2->requestedMipLevels);
    pQVar4 = QDebug::operator<<(pQVar4,", layers=");
    pQVar4 = QDebug::operator<<(pQVar4,pQVar2->layers);
    pQVar4 = QDebug::operator<<(pQVar4,", faces=");
    pQVar4 = QDebug::operator<<(pQVar4,pQVar2->faces);
    pQVar4 = QDebug::operator<<(pQVar4,", samples=");
    pQVar4 = QDebug::operator<<(pQVar4,pQVar2->samples);
    pQVar4 = QDebug::operator<<(pQVar4,", depthStencilMode=");
    local_b8.stream = pQVar4->stream;
    *(int *)(local_b8.stream + 0x28) = *(int *)(local_b8.stream + 0x28) + 1;
    operator<<((Stream *)&local_b0,(DepthStencilMode)&local_b8);
    pQVar4 = QDebug::operator<<(&local_b0,", comparisonFunction=");
    local_a8.stream = pQVar4->stream;
    *(int *)(local_a8.stream + 0x28) = *(int *)(local_a8.stream + 0x28) + 1;
    operator<<((Stream *)&local_a0,(ComparisonFunction)&local_a8);
    pQVar4 = QDebug::operator<<(&local_a0,", comparisonMode=");
    pQVar4 = QDebug::operator<<(pQVar4,pQVar2->comparisonMode);
    pQVar4 = QDebug::operator<<(pQVar4,", features=");
    local_98.stream = pQVar4->stream;
    *(int *)(local_98.stream + 0x28) = *(int *)(local_98.stream + 0x28) + 1;
    operator<<<QFlags<QOpenGLTexture::Feature>,_true>
              ((Stream *)&local_90,
               (QFlagsStorageHelper<QOpenGLTexture::Feature,_4>)SUB84(&local_98,0));
    pQVar4 = QDebug::operator<<(&local_90,", minificationFilter=");
    local_88.stream = pQVar4->stream;
    *(int *)(local_88.stream + 0x28) = *(int *)(local_88.stream + 0x28) + 1;
    operator<<((Stream *)&local_58,(Filter)&local_88);
    pQVar4 = QDebug::operator<<(&local_58,", magnificationFilter=");
    local_80.stream = pQVar4->stream;
    *(int *)(local_80.stream + 0x28) = *(int *)(local_80.stream + 0x28) + 1;
    operator<<((Stream *)local_48,(Filter)&local_80);
    pQVar4 = QDebug::operator<<((QDebug *)local_48,", wrapMode=");
    local_78.stream = pQVar4->stream;
    *(int *)(local_78.stream + 0x28) = *(int *)(local_78.stream + 0x28) + 1;
    operator<<((Stream *)local_70,(WrapMode)&local_78);
    QDebug::~QDebug((QDebug *)local_70);
    QDebug::~QDebug(&local_78);
    QDebug::~QDebug((QDebug *)local_48);
    QDebug::~QDebug(&local_80);
    QDebug::~QDebug(&local_58);
    QDebug::~QDebug(&local_88);
    QDebug::~QDebug(&local_90);
    QDebug::~QDebug(&local_98);
    QDebug::~QDebug(&local_a0);
    QDebug::~QDebug(&local_a8);
    QDebug::~QDebug(&local_b0);
    QDebug::~QDebug(&local_b8);
  }
  QDebug::operator<<((QDebug *)t,')');
  pQVar2 = (t->d_ptr).d;
  (t->d_ptr).d = (QOpenGLTexturePrivate *)0x0;
  *(QOpenGLTexturePrivate **)debug.stream = pQVar2;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QOpenGLTexture *t)
{
    QDebugStateSaver saver(debug);
    debug.nospace();
    debug << "QOpenGLTexture(";
    if (t) {
        const QOpenGLTexturePrivate *d = t->d_ptr.data();
        debug << d->target << ", bindingTarget=" << d->bindingTarget
            << ", size=[" << d->dimensions[0]
            << ", " << d->dimensions[1];
        if (d->target == QOpenGLTexture::Target3D)
            debug << ", " << d->dimensions[2];
        debug << "], format=" << d->format << ", formatClass=" << d->formatClass;
        if (t->isCreated())
            debug << ", textureId=" << d->textureId;
        if (t->isBound())
            debug << ", [bound]";
        if (t->isTextureView())
            debug << ", [view]";
        if (d->fixedSamplePositions)
            debug << ", [fixedSamplePositions]";
        debug << ", mipLevels=" << d->requestedMipLevels << ", layers=" << d->layers
            << ", faces=" << d->faces << ", samples=" << d->samples
            << ", depthStencilMode=" << d->depthStencilMode << ", comparisonFunction="
            << d->comparisonFunction << ", comparisonMode=" << d->comparisonMode
            << ", features=" << d->features << ", minificationFilter=" << d->minFilter
            << ", magnificationFilter=" << d->magFilter << ", wrapMode=" << d->wrapModes[0];
    } else {
        debug << '0';
    }
    debug << ')';
    return debug;
}